

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

bool __thiscall
re2::Regexp::ParseState::PushRepeatOp(ParseState *this,RegexpOp op,StringPiece *s,bool nongreedy)

{
  bool bVar1;
  RegexpOp op_00;
  Regexp *this_00;
  Regexp *pRVar2;
  Regexp **ppRVar3;
  Regexp *re;
  ParseFlags fl;
  bool nongreedy_local;
  StringPiece *s_local;
  RegexpOp op_local;
  ParseState *this_local;
  
  if (this->stacktop_ != (Regexp *)0x0) {
    op_00 = Regexp::op(this->stacktop_);
    bVar1 = IsMarker(this,op_00);
    if (!bVar1) {
      re._0_4_ = this->flags_;
      if (nongreedy) {
        re._0_4_ = operator^((ParseFlags)re,NonGreedy);
      }
      this_00 = (Regexp *)operator_new(0x28);
      Regexp(this_00,op,(ParseFlags)re);
      AllocSub(this_00,1);
      this_00->down_ = this->stacktop_->down_;
      pRVar2 = FinishRegexp(this,this->stacktop_);
      ppRVar3 = Regexp::sub(this_00);
      *ppRVar3 = pRVar2;
      bVar1 = ComputeSimple(this_00);
      this_00->simple_ = bVar1;
      this->stacktop_ = this_00;
      return true;
    }
  }
  RegexpStatus::set_code(this->status_,kRegexpRepeatArgument);
  RegexpStatus::set_error_arg(this->status_,s);
  return false;
}

Assistant:

bool Regexp::ParseState::PushRepeatOp(RegexpOp op, const StringPiece& s,
                                      bool nongreedy) {
  if (stacktop_ == NULL || IsMarker(stacktop_->op())) {
    status_->set_code(kRegexpRepeatArgument);
    status_->set_error_arg(s);
    return false;
  }
  Regexp::ParseFlags fl = flags_;
  if (nongreedy)
    fl = fl ^ NonGreedy;
  Regexp* re = new Regexp(op, fl);
  re->AllocSub(1);
  re->down_ = stacktop_->down_;
  re->sub()[0] = FinishRegexp(stacktop_);
  re->simple_ = re->ComputeSimple();
  stacktop_ = re;
  return true;
}